

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lys_node * warn_get_snode_in_ctx(lyxp_set *set)

{
  uint local_1c;
  uint32_t i;
  lyxp_set *set_local;
  
  if ((set != (lyxp_set *)0x0) && (set->type == LYXP_SET_SNODE_SET)) {
    local_1c = set->used;
    do {
      local_1c = local_1c - 1;
      if ((set->val).nodes[local_1c].pos == 1) {
        return (lys_node *)(set->val).nodes[local_1c].node;
      }
    } while (local_1c != 0);
  }
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
warn_get_snode_in_ctx(struct lyxp_set *set)
{
    uint32_t i;

    if (!set || (set->type != LYXP_SET_SNODE_SET)) {
        return NULL;
    }

    i = set->used;
    do {
        --i;
        if (set->val.snodes[i].in_ctx == 1) {
            /* if there are more, simply return the first found (last added) */
            return set->val.snodes[i].snode;
        }
    } while (i);

    return NULL;
}